

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.hpp
# Opt level: O2

string_view cinatra::get_gmt_time_str(time_point t)

{
  long t_00;
  long *in_FS_OFFSET;
  string_view sVar1;
  
  t_00 = (long)t.__d.__r / 1000000000;
  if (in_FS_OFFSET[-2] == t_00) {
    sVar1._M_str = (char *)(*in_FS_OFFSET + -0x30);
    sVar1._M_len = in_FS_OFFSET[-1];
  }
  else {
    sVar1 = get_gmt_time_str<32ul>((char (*) [32])(*in_FS_OFFSET + -0x30),t_00);
    in_FS_OFFSET[-1] = sVar1._M_len;
    in_FS_OFFSET[-2] = t_00;
  }
  return sVar1;
}

Assistant:

inline std::string_view get_gmt_time_str(
    std::chrono::system_clock::time_point t) {
  static thread_local char buf[32];
  static thread_local std::chrono::seconds last_sec{};
  static thread_local size_t last_size{};

  std::chrono::system_clock::duration d = t.time_since_epoch();
  std::chrono::seconds s = std::chrono::duration_cast<std::chrono::seconds>(d);
  if (last_sec == s) {
    return {buf, last_size};
  }

  auto tm = std::chrono::system_clock::to_time_t(t);

  auto str = get_gmt_time_str(buf, tm);
  last_size = str.size();
  last_sec = s;

  return str;
}